

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

char * httplib::detail::get_header_value(Headers *headers,char *key,size_t id,char *def)

{
  difference_type __d;
  const_iterator it;
  allocator<char> local_49;
  _Base_ptr local_48;
  key_type local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,key,&local_49);
  local_48 = (_Base_ptr)
             std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::find(&headers->_M_t,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::
  __advance<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,long>
            (&local_48,id);
  if ((_Rb_tree_header *)local_48 != &(headers->_M_t)._M_impl.super__Rb_tree_header) {
    def = *(char **)(local_48 + 2);
  }
  return def;
}

Assistant:

inline const char *get_header_value(const Headers &headers, const char *key,
                                    size_t id = 0, const char *def = nullptr) {
  auto it = headers.find(key);
  std::advance(it, id);
  if (it != headers.end()) { return it->second.c_str(); }
  return def;
}